

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_ssl.c
# Opt level: O3

void symmetric_ssl_main(void)

{
  short *psVar1;
  ushort uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  agent_type aVar7;
  uint uVar8;
  void *pvVar9;
  host_tuple *phVar10;
  SSL *s;
  char *__optval;
  char *__s;
  size_t sVar11;
  epoll_event *peVar12;
  request *prVar13;
  timestamp_info *b;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint64_t uVar17;
  size_t __nmemb;
  ulong uVar18;
  tcp_connection *conn;
  size_t *psVar19;
  long lVar20;
  long in_FS_OFFSET;
  byte_req_pair bVar21;
  sockaddr_in addr;
  int one;
  timespec latency;
  timespec rx_timestamp;
  timespec tx_timestamp;
  sockaddr local_98;
  void *local_88;
  int local_80;
  undefined4 local_7c;
  epoll_event *local_78;
  ulong local_70;
  timespec local_68;
  long local_58;
  timespec local_50;
  epoll_event local_40;
  
  local_88 = malloc(0x200);
  local_7c = 1;
  local_98.sa_family = 2;
  iVar4 = epoll_create(1);
  if (iVar4 < 0) {
    symmetric_ssl_main_cold_13();
    return;
  }
  iVar5 = get_conn_count();
  iVar6 = get_thread_count();
  iVar5 = iVar5 / iVar6;
  __nmemb = (size_t)iVar5;
  pvVar9 = calloc(__nmemb,0x4018);
  *(void **)(in_FS_OFFSET + -0x1b0) = pvVar9;
  if (pvVar9 == (void *)0x0) {
    __assert_fail("connections",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                  ,0x74,"int throughput_open_connections(void)");
  }
  aVar7 = get_agent_type();
  if ((aVar7 == SYMMETRIC_NIC_TIMESTAMP_AGENT) ||
     (aVar7 = get_agent_type(), aVar7 == SYMMETRIC_AGENT)) {
    pvVar9 = calloc(__nmemb,0x18);
    *(void **)(in_FS_OFFSET + -0x1c0) = pvVar9;
    if (pvVar9 == (void *)0x0) {
LAB_0010c981:
      __assert_fail("per_conn_tx_timestamps",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                    ,0x79,"int throughput_open_connections(void)");
    }
    if (iVar5 < 1) {
      get_targets();
      goto LAB_0010c356;
    }
    lVar14 = 0;
    do {
      iVar6 = get_max_pending_reqs();
      pvVar9 = calloc((long)iVar6,0x18);
      *(void **)(*(long *)(in_FS_OFFSET + -0x1c0) + 0x10 + lVar14) = pvVar9;
      if (pvVar9 == (void *)0x0) {
        __assert_fail("per_conn_tx_timestamps[i].pending",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x7d,"int throughput_open_connections(void)");
      }
      lVar14 = lVar14 + 0x18;
    } while (__nmemb * 0x18 != lVar14);
  }
  phVar10 = get_targets();
  if (0 < iVar5) {
    lVar14 = 0;
    uVar18 = 0;
    do {
      iVar6 = socket(2,1,0);
      if (iVar6 == -1) {
        symmetric_ssl_main_cold_12();
        return;
      }
      iVar5 = get_target_count();
      uVar16 = (long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) %
               (long)iVar5 & 0xffffffff;
      local_98.sa_data._0_2_ = phVar10[uVar16].port << 8 | phVar10[uVar16].port >> 8;
      local_98.sa_data._2_4_ = phVar10[uVar16].ip;
      iVar5 = connect(iVar6,&local_98,0x10);
      if (iVar5 != 0) {
        symmetric_ssl_main_cold_1();
        return;
      }
      lVar20 = *(long *)(in_FS_OFFSET + -0x1b0);
      *(int *)(lVar20 + lVar14) = iVar6;
      *(short *)(lVar20 + 4 + lVar14) = (short)uVar18;
      *(undefined2 *)(lVar20 + 10 + lVar14) = 0;
      *(undefined4 *)(lVar20 + 6 + lVar14) = 0;
      s = SSL_new((SSL_CTX *)ssl_ctx);
      *(SSL **)(lVar20 + 0x4010 + lVar14) = s;
      if (s == (SSL *)0x0) {
        __assert_fail("tls_conn->ssl",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x4d,"int ssl_init_connection(struct tls_connection *)");
      }
      iVar5 = SSL_set_fd(s,*(int *)(lVar20 + lVar14));
      if (iVar5 != 1) {
        __assert_fail("err == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x50,"int ssl_init_connection(struct tls_connection *)");
      }
      iVar5 = SSL_connect(*(SSL **)(lVar20 + 0x4010 + lVar14));
      if (iVar5 < 1) {
        symmetric_ssl_main_cold_11();
        return;
      }
      iVar5 = SSL_is_init_finished(*(undefined8 *)(lVar20 + 0x4010 + lVar14));
      if (iVar5 != 1) {
        __assert_fail("err == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x5c,"int ssl_init_connection(struct tls_connection *)");
      }
      iVar5 = fcntl(iVar6,4,0x800);
      if (iVar5 == -1) {
        symmetric_ssl_main_cold_10();
        return;
      }
      local_68.tv_sec._0_4_ = 0x80000;
      iVar5 = setsockopt(iVar6,1,7,&local_68,4);
      if (iVar5 != 0) {
        symmetric_ssl_main_cold_2();
        return;
      }
      local_68.tv_sec._0_4_ = 0x80000;
      iVar5 = setsockopt(iVar6,1,8,&local_68,4);
      if (iVar5 != 0) {
        symmetric_ssl_main_cold_3();
        return;
      }
      aVar7 = get_agent_type();
      if (aVar7 == SYMMETRIC_NIC_TIMESTAMP_AGENT) {
        __optval = get_if_name();
        __s = get_if_name();
        sVar11 = strlen(__s);
        iVar5 = setsockopt(iVar6,1,0x19,__optval,(socklen_t)sVar11);
        if (iVar5 != 0) {
          symmetric_ssl_main_cold_4();
          return;
        }
        iVar5 = sock_enable_timestamping(iVar6);
        if (iVar5 != 0) {
          symmetric_ssl_main_cold_5();
          return;
        }
      }
      iVar5 = setsockopt(iVar6,6,1,&local_7c,4);
      if (iVar5 != 0) {
        symmetric_ssl_main_cold_6();
        return;
      }
      local_50.tv_sec = 1;
      iVar5 = setsockopt(iVar6,1,0xd,&local_50,8);
      if (iVar5 != 0) {
        symmetric_ssl_main_cold_7();
        goto LAB_0010c981;
      }
      local_40.events = 1;
      local_40._4_4_ = (int)uVar18;
      iVar6 = epoll_ctl(iVar4,1,iVar6,&local_40);
      if (iVar6 != 0) {
        symmetric_ssl_main_cold_8();
        return;
      }
      uVar18 = uVar18 + 1;
      lVar14 = lVar14 + 0x4018;
    } while (__nmemb != uVar18);
  }
LAB_0010c356:
  *(int *)(in_FS_OFFSET + -0x1b8) = iVar4;
  iVar4 = get_conn_count();
  local_80 = get_thread_count();
  local_80 = iVar4 / local_80;
  peVar12 = (epoll_event *)malloc((long)local_80 * 0xc);
  pthread_barrier_wait((pthread_barrier_t *)&conn_open_barrier);
  set_conn_open(1);
  iVar4 = clock_gettime(1,(timespec *)&local_98);
  if (iVar4 != 0) {
LAB_0010c827:
    __assert_fail("r == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/inc/lancet/misc.h"
                  ,0x28,"int64_t time_ns()");
  }
  lVar14 = (long)((double)CONCAT44(local_98.sa_data._2_4_,
                                   CONCAT22(local_98.sa_data._0_2_,local_98.sa_family)) *
                  1000000000.0 + (double)(long)local_98.sa_data._6_8_);
  local_70 = 0x200;
  local_78 = peVar12;
  do {
    iVar4 = should_load();
    if (iVar4 == 0) {
      do {
        iVar4 = clock_gettime(1,(timespec *)&local_98);
        uVar3 = local_98.sa_data._6_8_;
        if (iVar4 != 0) goto LAB_0010c827;
        lVar14 = CONCAT44(local_98.sa_data._2_4_,CONCAT22(local_98.sa_data._0_2_,local_98.sa_family)
                         );
        iVar4 = should_load();
      } while (iVar4 == 0);
      lVar14 = (long)((double)lVar14 * 1000000000.0 + (double)(long)uVar3);
    }
    while( true ) {
      iVar4 = clock_gettime(1,(timespec *)&local_98);
      if (iVar4 != 0) goto LAB_0010c827;
      if ((long)((double)CONCAT44(local_98.sa_data._2_4_,
                                  CONCAT22(local_98.sa_data._0_2_,local_98.sa_family)) *
                 1000000000.0 + (double)(long)local_98.sa_data._6_8_) < lVar14) break;
      uVar8 = *(uint *)(in_FS_OFFSET + -0x1a8);
      *(uint *)(in_FS_OFFSET + -0x1a8) = uVar8 + 1;
      iVar4 = get_conn_count();
      iVar6 = get_thread_count();
      lVar20 = *(long *)(in_FS_OFFSET + -0x1b0);
      lVar15 = (long)(int)((ulong)uVar8 % ((long)iVar4 / (long)iVar6 & 0xffffffffU)) * 0x4018;
      uVar2 = *(ushort *)(lVar20 + 8 + lVar15);
      iVar4 = get_max_pending_reqs();
      if ((iVar4 <= (int)(uint)uVar2) || (lVar20 = lVar20 + lVar15, *(short *)(lVar20 + 6) != 0))
      break;
      prVar13 = prepare_request();
      iVar4 = prVar13->iov_cnt;
      if ((long)iVar4 < 1) {
        iVar6 = 0;
      }
      else {
        lVar15 = 0;
        iVar6 = 0;
        do {
          iVar6 = iVar6 + *(int *)((long)&prVar13->iovs[0].iov_len + lVar15);
          lVar15 = lVar15 + 0x10;
        } while ((long)iVar4 << 4 != lVar15);
      }
      uVar18 = (ulong)iVar6;
      pvVar9 = local_88;
      local_58 = lVar20;
      if (local_70 < uVar18) {
        free(local_88);
        pvVar9 = malloc(uVar18);
        iVar4 = prVar13->iov_cnt;
        local_70 = uVar18;
      }
      if (iVar4 < 1) {
        uVar16 = 0;
      }
      else {
        psVar19 = &prVar13->iovs[0].iov_len;
        lVar20 = 0;
        uVar16 = 0;
        do {
          memcpy((void *)((long)pvVar9 + uVar16),((iovec *)(psVar19 + -1))->iov_base,*psVar19);
          uVar16 = uVar16 + *psVar19;
          lVar20 = lVar20 + 1;
          psVar19 = psVar19 + 2;
        } while (lVar20 < prVar13->iov_cnt);
      }
      lVar20 = local_58;
      if (uVar16 != uVar18) {
        __assert_fail("copied == bytes_to_send",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x11f,"void symmetric_ssl_main(void)");
      }
      local_88 = pvVar9;
      iVar4 = SSL_write(*(SSL **)(local_58 + 0x4010),pvVar9,iVar6);
      if (iVar4 != iVar6) {
        __assert_fail("ret == bytes_to_send",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                      ,0x123,"void symmetric_ssl_main(void)");
      }
      iVar4 = clock_gettime(1,(timespec *)&local_40);
      if (iVar4 != 0) goto LAB_0010c846;
      push_complete_tx_timestamp
                ((pending_tx_timestamps *)
                 ((ulong)((uint)*(ushort *)(lVar20 + 4) * 0x18) + *(long *)(in_FS_OFFSET + -0x1c0)),
                 (timespec *)&local_40);
      psVar1 = (short *)(lVar20 + 8);
      *psVar1 = *psVar1 + 1;
      bVar21.reqs = 1;
      bVar21.bytes = uVar18;
      add_throughput_tx_sample(bVar21);
      lVar20 = get_ia();
      lVar14 = lVar14 + lVar20;
    }
    peVar12 = local_78;
    uVar8 = epoll_wait(*(int *)(in_FS_OFFSET + -0x1b8),local_78,local_80,0);
    if (0 < (int)uVar8) {
      uVar18 = 0;
      do {
        if (((&peVar12->events)[uVar18 * 3] & 1) == 0) {
          __assert_fail("events[i].events & EPOLLIN",
                        "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                        ,0x13a,"void symmetric_ssl_main(void)");
        }
        conn = (tcp_connection *)
               ((long)*(int *)(&peVar12->field_0x4 + uVar18 * 0xc) * 0x4018 +
               *(long *)(in_FS_OFFSET + -0x1b0));
        iVar4 = SSL_read(*(SSL **)&conn[1].idx,conn->buffer + conn->buffer_idx,
                         0x4000 - (uint)conn->buffer_idx);
        if (iVar4 < 1) {
          iVar6 = SSL_get_error(*(SSL **)&conn[1].idx,iVar4);
          if (iVar6 != 2) {
            if (iVar4 != 0) {
              symmetric_ssl_main_cold_9();
              return;
            }
            SSL_shutdown(*(SSL **)&conn[1].idx);
            SSL_free(*(SSL **)&conn[1].idx);
            close(conn->fd);
            conn->closed = 1;
          }
        }
        else {
          iVar6 = clock_gettime(1,&local_50);
          if (iVar6 != 0) {
LAB_0010c846:
            __assert_fail("r == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/inc/lancet/misc.h"
                          ,0x2f,"void time_ns_to_ts(struct timespec *)");
          }
          conn->buffer_idx = conn->buffer_idx + (short)iVar4;
          bVar21 = handle_response(conn);
          uVar17 = bVar21.reqs;
          if (uVar17 != 0) {
            conn->pending_reqs = conn->pending_reqs - (short)bVar21.reqs;
            do {
              b = pop_pending_tx_timestamps
                            ((pending_tx_timestamps *)
                             ((ulong)((uint)conn->idx * 0x18) + *(long *)(in_FS_OFFSET + -0x1c0)));
              if (b == (timestamp_info *)0x0) {
                __assert_fail("pending_tx",
                              "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                              ,0x15e,"void symmetric_ssl_main(void)");
              }
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
            iVar4 = timespec_diff(&local_68,(timespec *)&local_50,&b->time);
            if (iVar4 != 0) {
              __assert_fail("ret == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_ssl.c"
                            ,0x161,"void symmetric_ssl_main(void)");
            }
            add_latency_sample((long)((double)CONCAT44(local_68.tv_sec._4_4_,
                                                       (undefined4)local_68.tv_sec) * 1000000000.0 +
                                     (double)local_68.tv_nsec),&b->time);
            add_throughput_rx_sample(bVar21);
            peVar12 = local_78;
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar8);
    }
  } while( true );
}

Assistant:

static void symmetric_ssl_main(void)
{
	int ready, idx, i, j, conn_per_thread, ret, bytes_to_send;
	long next_tx, copied;
	struct epoll_event *events;
	struct tls_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;
	struct timespec tx_timestamp, rx_timestamp, latency;
	struct timestamp_info *pending_tx;
	char *wbuf;
	uint64_t wbuf_size = 512;

	wbuf = malloc(wbuf_size);

	if (throughput_open_connections())
		return;

	/*Initializations*/
	conn_per_thread = get_conn_count() / get_thread_count();
	events = malloc(conn_per_thread * sizeof(struct epoll_event));

	pthread_barrier_wait(&conn_open_barrier);
	set_conn_open(1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		while (time_ns() >= next_tx) {
			conn = pick_conn();
			if (!conn)
				goto REP_PROC;
			to_send = prepare_request();

			bytes_to_send = 0;
			for (i = 0; i < to_send->iov_cnt; i++)
				bytes_to_send += to_send->iovs[i].iov_len;

			if (bytes_to_send > wbuf_size) {
				free(wbuf);
				wbuf = malloc(bytes_to_send);
				wbuf_size = bytes_to_send;
			}

			copied = 0;
			for (i = 0; i < to_send->iov_cnt; i++) {
				memcpy(&wbuf[copied], to_send->iovs[i].iov_base,
					   to_send->iovs[i].iov_len);
				copied += to_send->iovs[i].iov_len;
			}
			assert(copied == bytes_to_send);

			int ret = SSL_write(conn->ssl, wbuf, bytes_to_send);

			assert(ret == bytes_to_send);

			time_ns_to_ts(&tx_timestamp);
			push_complete_tx_timestamp(&per_conn_tx_timestamps[conn->conn.idx],
									   &tx_timestamp);
			conn->conn.pending_reqs++;

			/*BookKeeping*/
			send_res.bytes = ret;
			send_res.reqs = 1;
			add_throughput_tx_sample(send_res);

			/*Schedule next*/
			next_tx += get_ia();
		}

	REP_PROC:
		/* process responses */
		ready = epoll_wait(epoll_fd, events, conn_per_thread, 0);
		for (i = 0; i < ready; i++) {
			idx = events[i].data.u32;
			conn = &connections[idx];
			/* Handle incoming packet */
			assert(events[i].events & EPOLLIN);

			// read into the connection buffer
			ret = SSL_read(conn->ssl, &conn->conn.buffer[conn->conn.buffer_idx],
						   MAX_PAYLOAD - conn->conn.buffer_idx);
			if (ret <= 0) {
				int ssl_err = SSL_get_error(conn->ssl, ret);
				if (ssl_err == SSL_ERROR_WANT_READ)
					continue;

				if (ret == 0) {
					SSL_shutdown(conn->ssl);
					SSL_free(conn->ssl);
					close(conn->conn.fd);
					conn->conn.closed = 1;
					continue;
				}

				lancet_fprintf(stderr, "Unexpected SSL error %d\n", ssl_err);
				return;
			}

			time_ns_to_ts(&rx_timestamp);
			conn->conn.buffer_idx += ret;

			read_res = handle_response(&conn->conn);
			if (read_res.reqs == 0)
				continue;

			conn->conn.pending_reqs -= read_res.reqs;
			/*
			 * Assume only the last request will have an rx timestamp!
			 */
			for (j = 0; j < read_res.reqs; j++) {
				pending_tx = pop_pending_tx_timestamps(
					&per_conn_tx_timestamps[conn->conn.idx]);
				assert(pending_tx);
			}
			ret = timespec_diff(&latency, &rx_timestamp, &pending_tx->time);
			assert(ret == 0);
			long diff = latency.tv_nsec + latency.tv_sec * 1e9;
			add_latency_sample(diff, &pending_tx->time);

			/* Bookkeeping */
			add_throughput_rx_sample(read_res);
		}
	}
}